

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cinproc.c
# Opt level: O2

int nn_cinproc_create(void *hint,nn_epbase **epbase)

{
  nn_fsm_fn *self;
  nn_fsm *self_00;
  nn_ctx *ctx;
  
  self_00 = (nn_fsm *)nn_alloc_(0x318);
  if (self_00 != (nn_fsm *)0x0) {
    self = &self_00[1].shutdown_fn;
    nn_ins_item_init((nn_ins_item *)self,&nn_cinproc_vfptr,hint);
    ctx = nn_epbase_getctx((nn_epbase *)self);
    nn_fsm_init_root(self_00,nn_cinproc_handler,nn_cinproc_shutdown,ctx);
    *(undefined4 *)&self_00[1].fn = 1;
    nn_sinproc_init((nn_sinproc *)&self_00[1].stopped,1,(nn_epbase *)self,self_00);
    nn_fsm_start(self_00);
    nn_ins_connect((nn_ins_item *)self,nn_cinproc_connect);
    *epbase = (nn_epbase *)self;
    return 0;
  }
  fprintf(_stderr,"Out of memory (%s:%d)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/inproc/cinproc.c"
          ,0x41);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

int nn_cinproc_create (void *hint, struct nn_epbase **epbase)
{
    struct nn_cinproc *self;

    self = nn_alloc (sizeof (struct nn_cinproc), "cinproc");
    alloc_assert (self);

    nn_ins_item_init (&self->item, &nn_cinproc_vfptr, hint);
    nn_fsm_init_root (&self->fsm, nn_cinproc_handler, nn_cinproc_shutdown,
        nn_epbase_getctx (&self->item.epbase));
    self->state = NN_CINPROC_STATE_IDLE;
    nn_sinproc_init (&self->sinproc, NN_CINPROC_SRC_SINPROC,
        &self->item.epbase, &self->fsm);

    /*  Start the state machine. */
    nn_fsm_start (&self->fsm);

    /*  Register the inproc endpoint into a global repository. */
    nn_ins_connect (&self->item, nn_cinproc_connect);

    *epbase = &self->item.epbase;
    return 0;
}